

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::anon_unknown_7::LineBufferTask::execute(LineBufferTask *this)

{
  uint uVar1;
  Format FVar2;
  uint uVar3;
  PixelType PVar4;
  long *plVar5;
  LineBuffer *pLVar6;
  PixelType *pPVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  Compression *pCVar11;
  Compressor *pCVar12;
  OutputStreamMutex *pOVar13;
  Data *pDVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int y;
  uint y_00;
  LineBuffer *pLVar19;
  char *pcVar20;
  ulong uVar21;
  bool bVar22;
  char *readPtr;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  pLVar19 = this->_lineBuffer;
  if ((pLVar19->buffer)._size == 0) {
    pDVar14 = this->_ofd;
    iVar9 = *(int *)((long)&(pDVar14->offsetInLineBuffer).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    FVar2 = *(Format *)((long)&pLVar19->endOfLineBufferData + 4);
    if ((int)pDVar14->format < (int)FVar2) {
      FVar2 = pDVar14->format;
    }
    iVar15 = *(int *)&pLVar19->endOfLineBufferData;
    iVar17 = FVar2 - iVar9;
    if ((int)FVar2 < iVar15) {
      pcVar20 = (char *)0x0;
    }
    else {
      lVar18 = (long)(iVar15 - iVar9) + -1;
      pcVar20 = (char *)0x0;
      do {
        pcVar20 = pcVar20 + *(int *)((pDVar14->lineBuffers).
                                     super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar18 + 1);
        lVar18 = lVar18 + 1;
      } while (lVar18 < iVar17);
    }
    plVar5 = *(long **)&pLVar19->minY;
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 8))(plVar5);
      pDVar14 = this->_ofd;
      iVar15 = *(int *)&this->_lineBuffer->endOfLineBufferData;
      iVar9 = *(int *)((long)&(pDVar14->offsetInLineBuffer).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      iVar17 = FVar2 - iVar9;
    }
    if ((int)FVar2 < iVar15) {
      pLVar19 = (LineBuffer *)0x0;
    }
    else {
      lVar18 = (long)(iVar15 - iVar9) + -1;
      pLVar19 = (LineBuffer *)0x0;
      do {
        pLVar6 = (pDVar14->lineBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar18 + 1];
        if (pLVar19 < pLVar6) {
          pLVar19 = pLVar6;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < iVar17);
    }
    pCVar11 = Header::compression((Header *)
                                  &(pDVar14->header)._map._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
    pCVar12 = newCompressor(*pCVar11,(size_t)pLVar19,
                            (Header *)
                            &(this->_ofd->header)._map._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count);
    pLVar19 = this->_lineBuffer;
    *(Compressor **)&pLVar19->minY = pCVar12;
    if ((pCVar12 == (Compressor *)0x0) || (pcVar20 <= pLVar19->dataPtr)) {
      pLVar19->scanLineMin = 1;
      (pLVar19->buffer)._size = (long)(pLVar19->buffer)._data;
    }
    else {
      iVar9 = (*pCVar12->_vptr_Compressor[3])(pCVar12);
      pLVar19 = this->_lineBuffer;
      pLVar19->scanLineMin = iVar9;
      iVar9 = (**(code **)(**(long **)&pLVar19->minY + 0x30))
                        (*(long **)&pLVar19->minY,(pLVar19->buffer)._data,
                         *(undefined4 *)&pLVar19->dataPtr,
                         *(undefined4 *)&pLVar19->endOfLineBufferData);
      this->_lineBuffer->dataPtr = (char *)(long)iVar9;
    }
  }
  pDVar14 = this->_ofd;
  uVar3 = *(uint *)((long)&this[1].super_Task._vptr_Task + 4);
  uVar1 = uVar3 + 1;
  y_00 = *(uint *)&this[1].super_Task._vptr_Task;
  uVar10 = y_00 - 1;
  bVar22 = *(int *)&(pDVar14->offsetInLineBuffer).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish == 0;
  if (!bVar22) {
    y_00 = uVar3;
    uVar1 = uVar10;
  }
  if (y_00 != uVar1) {
    do {
      local_40 = (long)(int)y_00;
      readPtr = (char *)((this->_lineBuffer->buffer)._size +
                        *(long *)(*(long *)&pDVar14->linesInBuffer +
                                 (local_40 -
                                 *(int *)((long)&(pDVar14->offsetInLineBuffer).
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 4)) * 8));
      pOVar13 = pDVar14->_streamData;
      if (*(OutputStreamMutex **)&pDVar14->_deleteStream != pOVar13) {
        local_48 = (ulong)~y_00;
        uVar16 = 0;
        uVar21 = 1;
        do {
          pPVar7 = *(PixelType **)
                    ((long)&(pOVar13->super_Mutex).super___mutex_base._M_mutex + uVar16 * 8);
          PVar4 = pPVar7[0xd];
          if ((int)y_00 < 0) {
            if (-1 < (int)PVar4) {
              uVar10 = ((int)local_48 + PVar4) / PVar4;
              goto LAB_004c7d3b;
            }
            uVar10 = (~PVar4 - y_00) / -PVar4;
          }
          else if ((int)PVar4 < 0) {
            uVar10 = y_00 / -PVar4;
LAB_004c7d3b:
            uVar10 = -uVar10;
          }
          else {
            uVar10 = y_00 / PVar4;
          }
          if (y_00 == uVar10 * PVar4) {
            if (*(byte *)((long)pPVar7 + 0x39) == 1) {
              skipChannel(&readPtr,pPVar7[1],
                          (ulong)*(uint *)((long)pDVar14[1].frameBuffer._map._M_t._M_impl.
                                                 super__Rb_tree_header._M_header._M_left +
                                          (local_40 -
                                          *(int *)((long)&(pDVar14->offsetInLineBuffer).
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4)) * 4));
            }
            else {
              uVar10 = *(uint *)&(pDVar14->offsetInLineBuffer).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_38 = (ulong)uVar10;
              iVar9 = *(int *)((long)&(pDVar14->offsetInLineBuffer).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 4);
              lVar18 = (long)(int)(uVar10 - iVar9) + 1;
              copyIntoDeepFrameBuffer
                        (&readPtr,*(char **)(pPVar7 + 2),
                         (char *)(*(long *)&pDVar14[1].frameBuffer._map._M_t._M_impl.
                                            super__Rb_tree_header._M_header + (long)iVar9 * -4 +
                                 *(int *)((long)&(pDVar14->offsetInLineBuffer).
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 4) * lVar18 * -4),4,(long)(int)lVar18 << 2,y_00,iVar9,
                         uVar10,0,0,0,0,*(undefined8 *)(pPVar7 + 10),*(undefined8 *)(pPVar7 + 6),
                         *(undefined8 *)(pPVar7 + 8),SUB41(pPVar7[0xe],0),*(double *)(pPVar7 + 0x10)
                         ,this->_lineBuffer->scanLineMin,*pPVar7,pPVar7[1]);
            }
          }
          pDVar14 = this->_ofd;
          pOVar13 = pDVar14->_streamData;
          bVar8 = uVar21 < (ulong)(*(long *)&pDVar14->_deleteStream - (long)pOVar13 >> 3);
          uVar16 = uVar21;
          uVar21 = (ulong)((int)uVar21 + 1);
        } while (bVar8);
      }
      y_00 = y_00 + (uint)bVar22 * 2 + -1;
    } while (y_00 != uVar1);
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //
    
        if (_lineBuffer->uncompressedData == 0)
        {
            size_t uncompressedSize = 0;
            int maxY = min (_lineBuffer->maxY, _ifd->maxY);
    
            for (int i = _lineBuffer->minY - _ifd->minY;
                 i <= maxY - _ifd->minY;
		 ++i)
	    {
                uncompressedSize += _ifd->bytesPerLine[i];
	    }
    
            if (_lineBuffer->compressor &&
                static_cast<size_t>(_lineBuffer->dataSize) < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format();

                _lineBuffer->dataSize = _lineBuffer->compressor->uncompress
                    (_lineBuffer->buffer,
                     _lineBuffer->dataSize,
		     _lineBuffer->minY,
                     _lineBuffer->uncompressedData);
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //
    
                _lineBuffer->format = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;
            }
        }
        
        int yStart, yStop, dy;

        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop = _scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop = _scanLineMin - 1;
            dy = -1;
        }
    
        for (int y = yStart; y != yStop; y += dy)
        {
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //
    
            const char *readPtr = _lineBuffer->uncompressedData +
                                  _ifd->offsetInLineBuffer[y - _ifd->minY];
    
            //
            // Iterate over all image channels.
            //
    
            for (unsigned int i = 0; i < _ifd->slices.size(); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
		// (the scan line contains data only if y % ySampling == 0).
                //
    
                const InSliceInfo &slice = _ifd->slices[i];
    
                if (modp (y, slice.ySampling) != 0)
                    continue;
    
                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //
    
                int dMinX = divp (_ifd->minX, slice.xSampling);
                int dMaxX = divp (_ifd->maxX, slice.xSampling);
    
                //
		// Fill the frame buffer with pixel data.
                //
    
                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //
    
                    skipChannel (readPtr, slice.typeInFile, dMaxX - dMinX + 1);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //
    
                    char *linePtr  = slice.base +
                                        intptr_t( divp (y, slice.ySampling) ) *
                                        intptr_t( slice.yStride );
    
                    char *writePtr = linePtr + intptr_t( dMinX ) * intptr_t( slice.xStride );
                    char *endPtr   = linePtr + intptr_t( dMaxX ) * intptr_t( slice.xStride );
                    
                    copyIntoFrameBuffer (readPtr, writePtr, endPtr,
                                         slice.xStride, slice.fill,
                                         slice.fillValue, _lineBuffer->format,
                                         slice.typeInFrameBuffer,
                                         slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}